

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O2

void __thiscall Pathie::Tempfile::Tempfile(Tempfile *this,string *namepart)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)namepart);
  TempEntry::TempEntry(&this->super_TempEntry,&local_30);
  std::__cxx11::string::_M_dispose();
  (this->super_TempEntry)._vptr_TempEntry = (_func_int **)&PTR__Tempfile_00114ce0;
  Path::touch(&(this->super_TempEntry).m_path);
  return;
}

Assistant:

Tempfile::Tempfile(std::string namepart)
  : TempEntry(namepart)
{
  m_path.touch();
}